

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O0

void __thiscall
SuiteDataDictionaryTests::TestcheckValidTagNumberFixturecheckValidTagNumber::
TestcheckValidTagNumberFixturecheckValidTagNumber
          (TestcheckValidTagNumberFixturecheckValidTagNumber *this)

{
  char *suiteName;
  TestcheckValidTagNumberFixturecheckValidTagNumber *this_local;
  
  suiteName = SuiteDataDictionaryTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"checkValidTagNumber",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/DataDictionaryTestCase.cpp"
             ,0xf2);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestcheckValidTagNumberFixturecheckValidTagNumber_00456170;
  return;
}

Assistant:

TEST_FIXTURE(checkValidTagNumberFixture, checkValidTagNumber)
{
  object.checkFieldsOutOfOrder(true);
  TestReqID testReqID( "1" );
  FIX40::TestRequest message( testReqID );
  message.setField( TooHigh( "value" ) );
  CHECK_THROW( object.validate( message ), InvalidTagNumber );

  object.allowUnknownMsgFields( true );
  object.validate( message );
  object.allowUnknownMsgFields( false );

  object.addField( 501 );
  object.addMsgField( MsgType_TestRequest, 501 );
  object.validate( message );

  message.setField( FIELD::UserMin, "value" );
  CHECK_THROW( object.validate( message ), InvalidTagNumber );

  object.checkUserDefinedFields( false );
  object.validate( message );
}